

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BuffLength::Run(BuffLength *this)

{
  CallLogWrapper *this_00;
  long *src_vs;
  GLuint program;
  GLuint index;
  long lVar1;
  GLchar buff [3];
  GLsizei length;
  GLint params [3];
  GLenum props [13];
  char local_90 [4];
  int local_8c;
  undefined8 local_88;
  int local_80;
  long local_78 [2];
  long *local_68;
  undefined8 uStack_60;
  long local_58 [4];
  undefined4 local_38;
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&local_68,this);
  src_vs = local_68;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(&local_88,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,(char *)local_88,false);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  lVar1 = 0;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  index = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,program,0x92e1,"someLongName");
  local_90[2] = 'c';
  local_90[0] = 'a';
  local_90[1] = 'b';
  glu::CallLogWrapper::glGetProgramResourceName
            (this_00,program,0x92e1,index,0,(GLsizei *)0x0,(GLchar *)0x0);
  glu::CallLogWrapper::glGetProgramResourceName
            (this_00,program,0x92e1,index,0,(GLsizei *)0x0,local_90);
  if (((local_90[0] != 'a') || (local_90[1] != 'b')) || (local_90[2] != 'c')) {
    anon_unknown_0::Output("ERROR: buff has changed\n");
    lVar1 = -1;
  }
  glu::CallLogWrapper::glGetProgramResourceName(this_00,program,0x92e1,index,2,&local_8c,local_90);
  if (((local_90[0] != 's') || (local_90[1] != '\0')) || (local_90[2] != 'c')) {
    anon_unknown_0::Output("ERROR: buff different then expected\n");
    lVar1 = -1;
  }
  if (local_8c != 1) {
    anon_unknown_0::Output("ERROR: incorrect length, expected 1, got %d\n");
    lVar1 = -1;
  }
  local_88 = (long *)0x200000001;
  local_80 = 3;
  local_58[2] = 0x930b00009301;
  local_58[3] = 0x93060000930a;
  local_58[0] = 0x92fe000092fd;
  local_58[1] = 0x9300000092ff;
  local_68 = (long *)0x92fa000092f9;
  uStack_60 = 0x92fc000092fb;
  local_38 = 0x930e;
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e1,index,0xd,(GLenum *)&local_68,0,(GLsizei *)0x0,(GLint *)0x0);
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e1,index,0xd,(GLenum *)&local_68,0,(GLsizei *)0x0,
             (GLint *)&local_88);
  if ((((int)local_88 != 1) || (local_88._4_4_ != 2)) || (local_80 != 3)) {
    anon_unknown_0::Output("ERROR: params has changed\n");
    lVar1 = -1;
  }
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e1,index,0xd,(GLenum *)&local_68,2,&local_8c,(GLint *)&local_88);
  if ((((int)local_88 != 0xd) || (local_88._4_4_ != 0x8b52)) || (local_80 != 3)) {
    anon_unknown_0::Output("ERROR: params has incorrect values\n");
    lVar1 = -1;
  }
  if (local_8c != 2) {
    anon_unknown_0::Output("ERROR: incorrect length, expected 2, got %d\n");
    lVar1 = -1;
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		GLuint  index = glGetProgramResourceIndex(program, GL_UNIFORM, "someLongName");
		GLsizei length;
		GLchar  buff[3] = { 'a', 'b', 'c' };
		glGetProgramResourceName(program, GL_UNIFORM, index, 0, NULL, NULL);
		glGetProgramResourceName(program, GL_UNIFORM, index, 0, NULL, buff);
		if (buff[0] != 'a' || buff[1] != 'b' || buff[2] != 'c')
		{
			Output("ERROR: buff has changed\n");
			error = ERROR;
		}
		glGetProgramResourceName(program, GL_UNIFORM, index, 2, &length, buff);
		if (buff[0] != 's' || buff[1] != '\0' || buff[2] != 'c')
		{
			Output("ERROR: buff different then expected\n");
			error = ERROR;
		}
		if (length != 1)
		{
			Output("ERROR: incorrect length, expected 1, got %d\n", length);
			error = ERROR;
		}

		GLint  params[3] = { 1, 2, 3 };
		GLenum props[]   = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 0, NULL, NULL);
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 0, NULL, params);
		if (params[0] != 1 || params[1] != 2 || params[2] != 3)
		{
			Output("ERROR: params has changed\n");
			error = ERROR;
		}
		glGetProgramResourceiv(program, GL_UNIFORM, index, 13, props, 2, &length, params);
		if (params[0] != 13 || params[1] != GL_FLOAT_VEC4 || params[2] != 3)
		{
			Output("ERROR: params has incorrect values\n");
			error = ERROR;
		}
		if (length != 2)
		{
			Output("ERROR: incorrect length, expected 2, got %d\n", length);
			error = ERROR;
		}

		glDeleteProgram(program);
		return error;
	}